

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

string_view __thiscall bloaty::ArgParser::Arg(ArgParser *this)

{
  string_view sVar1;
  bool bVar2;
  ArgParser *in_RDI;
  ArgParser *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffff0;
  char *local_8;
  
  __str = in_RDI;
  bVar2 = IsDone(in_RDI);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!IsDone()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x7f0,"string_view bloaty::ArgParser::Arg()");
  }
  std::vector<char_*,_std::allocator<char_*>_>::operator[](&in_RDI->argv_,(long)in_RDI->index_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffff0,(char *)__str);
  sVar1._M_str = local_8;
  sVar1._M_len = (size_t)in_stack_fffffffffffffff0;
  return sVar1;
}

Assistant:

string_view Arg() {
    assert(!IsDone());
    return string_view(argv_[index_]);
  }